

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O3

ReadFileResult __thiscall
cmCTestResourceSpec::ReadFromJSONFile(cmCTestResourceSpec *this,string *filename)

{
  long *plVar1;
  bool bVar2;
  ReadFileResult RVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  ReadFileResult RVar4;
  ReadFileResult RVar5;
  long *plVar6;
  TopVersion version;
  Value root;
  CharReaderBuilder builder;
  ifstream fin;
  undefined8 local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  pointer local_2a8;
  cmCTestResourceSpec *local_298;
  Value local_290;
  CharReaderBuilder local_268;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  RVar3 = FILE_NOT_FOUND;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    Json::Value::Value(&local_290,nullValue);
    Json::CharReaderBuilder::CharReaderBuilder(&local_268);
    bVar2 = Json::parseFromStream
                      (&local_268.super_Factory,(IStream *)local_238,&local_290,(String *)0x0);
    RVar4 = JSON_PARSE_ERROR;
    RVar5 = JSON_PARSE_ERROR;
    RVar3 = RVar5;
    if (bVar2) {
      local_300 = 1;
      bVar2 = Json::Value::isObject(&local_290);
      RVar3 = DAT_00961b48;
      if (bVar2) {
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_298 = this;
        Json::Value::getMemberNames_abi_cxx11_((Members *)&local_2b8,&local_290);
        local_2d8._16_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2d8._8_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2d8._0_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2a8;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2b8._M_allocated_capacity;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2b8._8_8_;
        local_2b8._M_allocated_capacity = 0;
        local_2b8._8_8_ = (Value *)0x0;
        local_2a8 = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2b8);
        plVar1 = DAT_00961b30;
        if ((anonymous_namespace)::RootVersionHelper != DAT_00961b30) {
          plVar6 = (anonymous_namespace)::RootVersionHelper;
          do {
            local_2d8._0_8_ = (pointer)(local_2d8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2d8,plVar6[1],*plVar6 + plVar6[1]);
            bVar2 = Json::Value::isMember(&local_290,(String *)local_2d8);
            if (bVar2) {
              local_2b8._M_allocated_capacity =
                   (size_type)Json::Value::operator[](&local_290,(String *)local_2d8);
              if (plVar6[4] == 0) {
                std::__throw_bad_function_call();
              }
              RVar3 = (*(code *)plVar6[5])(plVar6 + 2,&local_300,&local_2b8);
              if (RVar3 == DAT_00961b44) {
                __position = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (local_2f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        local_2f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        (String *)local_2d8);
                bVar2 = true;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase(&local_2f8,(iterator)__position._M_current);
              }
              else {
                bVar2 = false;
                RVar5 = RVar3;
                RVar4 = RVar3;
              }
            }
            else if ((char)plVar6[6] == '\0') {
              local_2b8._M_allocated_capacity = 0;
              if (plVar6[4] == 0) {
                std::__throw_bad_function_call();
              }
              RVar3 = (*(code *)plVar6[5])(plVar6 + 2,&local_300,&local_2b8);
              bVar2 = RVar3 == DAT_00961b44;
              RVar5 = RVar4;
              if (!bVar2) {
                RVar5 = RVar3;
                RVar4 = RVar3;
              }
            }
            else {
              bVar2 = false;
              RVar5 = DAT_00961b48;
              RVar4 = DAT_00961b48;
            }
            if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
              operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
            }
            if (!bVar2) goto LAB_001fef92;
            plVar6 = plVar6 + 7;
          } while (plVar6 != plVar1);
        }
        RVar5 = (&DAT_00961b44)
                [local_2f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_2f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish & ~DAT_00961b4c];
LAB_001fef92:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        this = local_298;
        RVar3 = RVar5;
      }
      if (RVar3 == READ_OK) {
        RVar3 = UNSUPPORTED_VERSION;
        if (((int)local_300 == 1) && (local_300._4_4_ == 0)) {
          RVar3 = cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
                  Object<cmCTestResourceSpec>::operator()
                            ((Object<cmCTestResourceSpec> *)(anonymous_namespace)::RootHelper,this,
                             &local_290);
        }
      }
    }
    Json::CharReaderBuilder::~CharReaderBuilder(&local_268);
    Json::Value::~Value(&local_290);
  }
  std::ifstream::~ifstream(local_238);
  return RVar3;
}

Assistant:

cmCTestResourceSpec::ReadFileResult cmCTestResourceSpec::ReadFromJSONFile(
  const std::string& filename)
{
  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    return ReadFileResult::FILE_NOT_FOUND;
  }

  Json::Value root;
  Json::CharReaderBuilder builder;
  if (!Json::parseFromStream(builder, fin, &root, nullptr)) {
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  TopVersion version;
  ReadFileResult result;
  if ((result = RootVersionHelper(version, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }
  if (version.Version.Major != 1 || version.Version.Minor != 0) {
    return ReadFileResult::UNSUPPORTED_VERSION;
  }

  return RootHelper(*this, &root);
}